

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::StaticAssertTask::StaticAssertTask(StaticAssertTask *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"$static_assert",&local_31)
  ;
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,&local_30,Task);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00477920;
  return;
}

Assistant:

StaticAssertTask() : SystemSubroutine("$static_assert", SubroutineKind::Task) {}